

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_0::ReferenceProgram::render
          (ReferenceProgram *this,Surface *target,float x1,float y1,float x2,float y2,
          DrawType drawType)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_58;
  int local_54;
  int x;
  int y;
  RGBA color;
  int y2i;
  int x2i;
  int y1i;
  int x1i;
  int py;
  int px;
  int oy;
  int ox;
  DrawType drawType_local;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  Surface *target_local;
  ReferenceProgram *this_local;
  
  if ((drawType == DRAWTYPE_GLES2_RENDER) || (drawType == DRAWTYPE_GLES2_CLEAR)) {
    iVar1 = tcu::Surface::getWidth(target);
    iVar2 = tcu::Surface::getHeight(target);
    iVar3 = tcu::Surface::getWidth(target);
    iVar4 = tcu::Surface::getHeight(target);
    color.m_value = (deUint32)(((float)iVar3 / 2.0) * x2 + (float)(iVar1 / 2));
    y = (int)(((float)iVar4 / 2.0) * y2 + (float)(iVar2 / 2));
    tcu::RGBA::RGBA((RGBA *)&x,0x7f,0x7f,0x7f,0xff);
    for (local_54 = (int)(((float)iVar4 / 2.0) * y1 + (float)(iVar2 / 2));
        local_58 = (int)(((float)iVar3 / 2.0) * x1 + (float)(iVar1 / 2)), local_54 <= y;
        local_54 = local_54 + 1) {
      for (; local_58 <= (int)color.m_value; local_58 = local_58 + 1) {
        tcu::Surface::setPixel(target,local_58,local_54,(RGBA)x);
      }
    }
  }
  return;
}

Assistant:

void ReferenceProgram::render (tcu::Surface* target, float x1, float y1, float x2, float y2, PreservingSwapTest::DrawType drawType)
{
	if (drawType == PreservingSwapTest::DRAWTYPE_GLES2_RENDER || drawType == PreservingSwapTest::DRAWTYPE_GLES2_CLEAR)
	{
		const int ox	= target->getWidth()/2;
		const int oy	= target->getHeight()/2;

		const int px	= target->getWidth();
		const int py	= target->getHeight();

		const int x1i	= (int)((px/2.0) * x1 + ox);
		const int y1i	= (int)((py/2.0) * y1 + oy);

		const int x2i	= (int)((px/2.0) * x2 + ox);
		const int y2i	= (int)((py/2.0) * y2 + oy);

		const tcu::RGBA	color(127, 127, 127, 255);

		for (int y = y1i; y <= y2i; y++)
		{
			for (int x = x1i; x <= x2i; x++)
				target->setPixel(x, y, color);
		}
	}
	else
		DE_ASSERT(false);
}